

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environ.cpp
# Opt level: O2

BOOL FreeEnvironmentStringsW(LPWSTR lpValue)

{
  if (PAL_InitializeChakraCoreCalled) {
    if (lpValue != (LPWSTR)0x0) {
      PAL_free(lpValue);
    }
    if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
      return 1;
    }
  }
  abort();
}

Assistant:

BOOL
PALAPI
FreeEnvironmentStringsW(
            IN LPWSTR lpValue)
{
    PERF_ENTRY(FreeEnvironmentStringsW);
    ENTRY("FreeEnvironmentStringsW(lpValue=%p (%S))\n", lpValue?lpValue:W16_NULLSTRING, lpValue?lpValue:W16_NULLSTRING);

    if (lpValue != NULL)
    {
        PAL_free(lpValue);
    }

    LOGEXIT("FreeEnvironmentStringW returning BOOL TRUE\n");
    PERF_EXIT(FreeEnvironmentStringsW);
    return TRUE ;
}